

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseProperty(char *in,char *end,Property **prop)

{
  Value *pVVar1;
  bool bVar2;
  Reference *this;
  size_type numrefs;
  reference names_00;
  Property *this_00;
  Reference *ref;
  undefined1 local_50 [8];
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *primData;
  Text *id;
  Property **prop_local;
  char *end_local;
  char *in_local;
  
  *prop = (Property *)0x0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    id = (Text *)prop;
    prop_local = (Property **)end;
    end_local = in;
    end_local = lookForNextToken<char>(in,end);
    primData = (Value *)0x0;
    end_local = parseIdentifier(end_local,(char *)prop_local,(Text **)&primData);
    if (primData != (Value *)0x0) {
      end_local = lookForNextToken<char>(end_local,(char *)prop_local);
      pVVar1 = primData;
      if (*end_local == '=') {
        end_local = end_local + 1;
        end_local = getNextToken<char>(end_local,(char *)prop_local);
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = isInteger<char>(end_local,(char *)prop_local);
        if (bVar2) {
          end_local = parseIntegerLiteral(end_local,(char *)prop_local,
                                          (Value **)
                                          &names.
                                           super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          ddl_int32);
          createPropertyWithData
                    ((Text *)primData,
                     (Value *)names.
                              super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Property **)id);
        }
        else {
          bVar2 = isFloat<char>(end_local,(char *)prop_local);
          if (bVar2) {
            end_local = parseFloatingLiteral
                                  (end_local,(char *)prop_local,
                                   (Value **)
                                   &names.
                                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ddl_float);
            createPropertyWithData
                      ((Text *)primData,
                       (Value *)names.
                                super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Property **)id);
          }
          else {
            bVar2 = isStringLiteral<char>(*end_local);
            if (bVar2) {
              end_local = parseStringLiteral(end_local,(char *)prop_local,
                                             (Value **)
                                             &names.
                                              super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              createPropertyWithData
                        ((Text *)primData,
                         (Value *)names.
                                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Property **)id
                        );
            }
            else {
              std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::vector
                        ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_50
                        );
              end_local = parseReference(end_local,(char *)prop_local,
                                         (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                          *)local_50);
              bVar2 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::empty
                                ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                                 local_50);
              if (!bVar2) {
                this = (Reference *)operator_new(0x10);
                numrefs = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::size
                                    ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                      *)local_50);
                names_00 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::
                           operator[]((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                       *)local_50,0);
                Reference::Reference(this,numrefs,names_00);
                this_00 = (Property *)operator_new(0x20);
                Property::Property(this_00,(Text *)primData);
                id->m_capacity = (size_t)this_00;
                *(Reference **)(id->m_capacity + 0x10) = this;
              }
              std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::~vector
                        ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_50
                        );
            }
          }
        }
      }
      else if (primData != (Value *)0x0) {
        Text::~Text((Text *)primData);
        operator_delete(pVVar1,0x18);
      }
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseProperty( char *in, char *end, Property **prop ) {
    *prop = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( ddl_nullptr != id ) {
        in = lookForNextToken( in, end );
        if( *in == '=' ) {
            ++in;
            in = getNextToken( in, end );
            Value *primData( ddl_nullptr );
            if( isInteger( in, end ) ) {
                in = parseIntegerLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isFloat( in, end ) ) {
                in = parseFloatingLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isStringLiteral( *in ) ) { // string data
                in = parseStringLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else {                              // reference data
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    ( *prop ) = new Property( id );
                    ( *prop )->m_ref = ref;
                }
            }
        } else {
            delete id;
        }
    }

    return in;
}